

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.hpp
# Opt level: O1

void __thiscall
backend::codegen::FunctionNotFoundError::FunctionNotFoundError
          (FunctionNotFoundError *this,string *fn_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  *(undefined ***)this = &PTR__FunctionNotFoundError_001ef210;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  std::operator+(&local_40,"Function not found: ",fn_id);
  std::__cxx11::string::operator=((string *)&this->what_,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FunctionNotFoundError(std::string fn_id) : std::exception() {
    what_ = "Function not found: " + fn_id;
  }